

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_hdwallet.cpp
# Opt level: O2

CreateExtkeyResponseStruct *
cfd::js::api::HDWalletStructApi::CreateExtkeyFromParentKey
          (CreateExtkeyResponseStruct *__return_storage_ptr__,
          CreateExtkeyFromParentKeyRequestStruct *request)

{
  string *in_R8;
  allocator local_119;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  function<cfd::js::api::CreateExtkeyResponseStruct_(const_cfd::js::api::CreateExtkeyFromParentKeyRequestStruct_&)>
  local_f8;
  CreateExtkeyResponseStruct local_d8;
  
  CreateExtkeyResponseStruct::CreateExtkeyResponseStruct(__return_storage_ptr__);
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_100 = std::
              _Function_handler<cfd::js::api::CreateExtkeyResponseStruct_(const_cfd::js::api::CreateExtkeyFromParentKeyRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_hdwallet.cpp:197:20)>
              ::_M_invoke;
  local_108 = std::
              _Function_handler<cfd::js::api::CreateExtkeyResponseStruct_(const_cfd::js::api::CreateExtkeyFromParentKeyRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_hdwallet.cpp:197:20)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_f8,"CreateExtkeyFromParentKey",&local_119);
  ExecuteStructApi<cfd::js::api::CreateExtkeyFromParentKeyRequestStruct,cfd::js::api::CreateExtkeyResponseStruct>
            (&local_d8,(api *)request,(CreateExtkeyFromParentKeyRequestStruct *)&local_118,&local_f8
             ,in_R8);
  CreateExtkeyResponseStruct::operator=(__return_storage_ptr__,&local_d8);
  CreateExtkeyResponseStruct::~CreateExtkeyResponseStruct(&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_118);
  return __return_storage_ptr__;
}

Assistant:

CreateExtkeyResponseStruct HDWalletStructApi::CreateExtkeyFromParentKey(
    const CreateExtkeyFromParentKeyRequestStruct& request) {
  auto call_func = [](const CreateExtkeyFromParentKeyRequestStruct& request)
      -> CreateExtkeyResponseStruct {
    CreateExtkeyResponseStruct response;
    const NetType net_type = AddressStructApi::ConvertNetType(request.network);
    ExtKeyType key_type = ConvertExtKeyType(request.extkey_type);
    uint32_t child_num = request.child_number;
    if (request.hardened) child_num |= 0x80000000U;

    if (key_type == ExtKeyType::kExtPrivkey) {
      Privkey privkey;
      if (request.parent_key.size() == (Privkey::kPrivkeySize * 2)) {
        privkey = Privkey(request.parent_key);
      } else {
        privkey = Privkey::FromWif(request.parent_key, net_type);
      }
      ExtPrivkey extprivkey(
          net_type, privkey, ByteData256(request.parent_chain_code),
          request.parent_depth, child_num);
      response.extkey = extprivkey.ToString();
    } else {
      ExtPubkey extpubkey(
          net_type, Pubkey(request.parent_key),
          ByteData256(request.parent_chain_code), request.parent_depth,
          child_num);
      response.extkey = extpubkey.ToString();
    }

    return response;
  };

  CreateExtkeyResponseStruct result;
  result = ExecuteStructApi<
      CreateExtkeyFromParentKeyRequestStruct, CreateExtkeyResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}